

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DExporter::NodeHelper_OpenNode
          (X3DExporter *this,string *pNodeName,size_t pTabLevel,bool pEmptyElement,
          list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          *pAttrList)

{
  _List_node_base *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  IndentationStringSet(this,pTabLevel);
  XML_Write(this,&this->mIndentationString);
  std::operator+(&local_b0,"<",pNodeName);
  XML_Write(this,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  p_Var1 = (_List_node_base *)pAttrList;
  while (p_Var1 = (((_List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)pAttrList) {
    std::operator+(&local_70," ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                  );
    std::operator+(&local_50,&local_70,"=\'");
    std::operator+(&local_90,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 3)
                  );
    std::operator+(&local_b0,&local_90,"\'");
    XML_Write(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if (pEmptyElement) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"/>\n",(allocator<char> *)&local_90);
    XML_Write(this,&local_b0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,">\n",(allocator<char> *)&local_90);
    XML_Write(this,&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void X3DExporter::NodeHelper_OpenNode(const string& pNodeName, const size_t pTabLevel, const bool pEmptyElement, const list<SAttribute>& pAttrList)
{
	// Write indentation.
	IndentationStringSet(pTabLevel);
	XML_Write(mIndentationString);
	// Begin of the element
	XML_Write("<" + pNodeName);
	// Write attributes
	for(const SAttribute& attr: pAttrList) { XML_Write(" " + attr.Name + "='" + attr.Value + "'"); }

	// End of the element
	if(pEmptyElement)
	{
		XML_Write("/>\n");
	}
	else
	{
		XML_Write(">\n");
	}
}